

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::CopyClassExpression::fromSyntax
          (Compilation *compilation,CopyClassExpressionSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange;
  bool bVar1;
  ASTContext *context_00;
  SourceLocation this;
  CopyClassExpression *pCVar2;
  Diagnostic *expr;
  Expression *in_RDX;
  Compilation *in_RDI;
  SourceRange SVar3;
  CopyClassExpression *result;
  Expression *source;
  Expression *in_stack_ffffffffffffff68;
  Compilation *in_stack_ffffffffffffff88;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff90;
  SourceLocation SVar4;
  SyntaxNode *in_stack_ffffffffffffffb8;
  bitmask<slang::ast::ASTFlags> local_30;
  SourceLocation local_28;
  Expression *local_20;
  Compilation *local_10;
  CopyClassExpression *local_8;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  context_00 = (ASTContext *)
               not_null<slang::syntax::ExpressionSyntax_*>::operator*
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9fb9da);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,None);
  local_28 = (SourceLocation)
             Expression::selfDetermined
                       (in_stack_ffffffffffffff88,(ExpressionSyntax *)local_20,context_00,
                        in_stack_ffffffffffffff90);
  this = (SourceLocation)
         not_null<const_slang::ast::Type_*>::operator*
                   ((not_null<const_slang::ast::Type_*> *)0x9fba30);
  SVar4 = local_28;
  SVar3 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffffb8);
  pCVar2 = BumpAllocator::
           emplace<slang::ast::CopyClassExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                     ((BumpAllocator *)this,(Type *)local_10,local_20,(SourceRange *)context_00);
  bVar1 = Expression::bad((Expression *)in_RDI);
  if (bVar1) {
    local_8 = (CopyClassExpression *)Expression::badExpr(in_RDI,in_stack_ffffffffffffff68);
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x9fbab7);
    bVar1 = Type::isClass((Type *)0x9fbabf);
    local_8 = pCVar2;
    if (!bVar1) {
      sourceRange.endLoc = SVar4;
      sourceRange.startLoc = this;
      expr = ASTContext::addDiag((ASTContext *)local_10,
                                 SUB84((ulong)*(undefined8 *)((long)local_28 + 0x20) >> 0x20,0),
                                 sourceRange);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9fbb0e);
      ast::operator<<((Diagnostic *)SVar3.endLoc,(Type *)SVar3.startLoc);
      local_8 = (CopyClassExpression *)Expression::badExpr(in_RDI,(Expression *)expr);
    }
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& CopyClassExpression::fromSyntax(Compilation& compilation,
                                            const CopyClassExpressionSyntax& syntax,
                                            const ASTContext& context) {
    auto& source = selfDetermined(compilation, *syntax.expr, context);
    auto result = compilation.emplace<CopyClassExpression>(*source.type, source,
                                                           syntax.sourceRange());
    if (source.bad())
        return badExpr(compilation, result);

    if (!source.type->isClass()) {
        context.addDiag(diag::CopyClassTarget, source.sourceRange) << *source.type;
        return badExpr(compilation, result);
    }

    return *result;
}